

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int nodeVPush(xmlValidCtxtPtr ctxt,xmlNodePtr value)

{
  int iVar1;
  int extraout_EAX;
  xmlNodePtr *ppxVar2;
  xmlNodePtr *extraout_RAX;
  xmlNodePtr *ppxVar3;
  
  if (ctxt->nodeMax < 1) {
    ctxt->nodeMax = 4;
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x20);
    ctxt->nodeTab = ppxVar2;
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlVErrMemory(ctxt,"malloc failed");
      ctxt->nodeMax = 0;
      return extraout_EAX;
    }
  }
  if (ctxt->nodeMax <= ctxt->nodeNr) {
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(ctxt->nodeTab,(long)ctxt->nodeMax << 4);
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      xmlVErrMemory(ctxt,"realloc failed");
      ppxVar3 = extraout_RAX;
    }
    else {
      ctxt->nodeMax = ctxt->nodeMax << 1;
      ctxt->nodeTab = ppxVar2;
      ppxVar3 = ppxVar2;
    }
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      return (int)ppxVar3;
    }
  }
  iVar1 = ctxt->nodeNr;
  ctxt->nodeTab[iVar1] = value;
  ctxt->node = value;
  iVar1 = iVar1 + 1;
  ctxt->nodeNr = iVar1;
  return iVar1;
}

Assistant:

static int
nodeVPush(xmlValidCtxtPtr ctxt, xmlNodePtr value)
{
    if (ctxt->nodeMax <= 0) {
        ctxt->nodeMax = 4;
        ctxt->nodeTab =
            (xmlNodePtr *) xmlMalloc(ctxt->nodeMax *
                                     sizeof(ctxt->nodeTab[0]));
        if (ctxt->nodeTab == NULL) {
	    xmlVErrMemory(ctxt, "malloc failed");
            ctxt->nodeMax = 0;
            return (0);
        }
    }
    if (ctxt->nodeNr >= ctxt->nodeMax) {
        xmlNodePtr *tmp;
        tmp = (xmlNodePtr *) xmlRealloc(ctxt->nodeTab,
			      ctxt->nodeMax * 2 * sizeof(ctxt->nodeTab[0]));
        if (tmp == NULL) {
	    xmlVErrMemory(ctxt, "realloc failed");
            return (0);
        }
        ctxt->nodeMax *= 2;
	ctxt->nodeTab = tmp;
    }
    ctxt->nodeTab[ctxt->nodeNr] = value;
    ctxt->node = value;
    return (ctxt->nodeNr++);
}